

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoa.h
# Opt level: O1

size_t floaxie::ftoa<float,char>(float v,char *buffer)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *buffer_00;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int K;
  int len;
  uint local_38;
  uint local_34;
  
  if (NAN(v)) {
    builtin_strncpy(buffer,"nan",4);
  }
  else {
    if (ABS(v) != INFINITY) {
      if ((v == 0.0) && (!NAN(v))) {
        buffer[0] = '0';
        buffer[1] = '\0';
        return 1;
      }
      *buffer = '-';
      buffer_00 = buffer + (v < 0.0);
      grisu2<_19,_16,float,char>(v,buffer_00,(int *)&local_34,(int *)&local_38);
      uVar8 = local_38 + local_34;
      uVar4 = -local_38;
      if (uVar8 != uVar4 && SBORROW4(uVar8,uVar4) == (int)(uVar8 + local_38) < 0) {
        uVar4 = uVar8;
      }
      if (uVar4 < 0x11) {
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        iVar6 = (int)uVar7;
        uVar4 = iVar6 - ((int)local_38 >> 0x1f);
        if ((int)uVar8 < 1) {
          uVar4 = 2 - uVar8;
        }
        uVar2 = 2 - uVar8;
        if (0 < (int)uVar8) {
          uVar2 = 0;
        }
        uVar5 = 1;
        if (0 < (int)uVar8) {
          uVar5 = (ulong)uVar8;
        }
        uVar8 = local_38;
        if ((int)local_38 < 1) {
          uVar8 = 0;
        }
        uVar3 = local_34 - iVar6;
        if ((int)(local_34 - iVar6) < 1) {
          uVar3 = 0;
        }
        uVar9 = (ulong)(((uVar8 + local_34) - iVar6) + uVar4);
        memmove(buffer_00 + uVar4,buffer_00 + uVar7,(ulong)uVar3);
        memset(buffer_00,0x30,(ulong)uVar2);
        memset(buffer_00 + local_34,0x30,(ulong)uVar8);
        buffer_00[uVar5] = '.';
        buffer_00[uVar9] = '\0';
      }
      else {
        if (1 < local_34) {
          memmove(buffer_00 + 2,buffer_00 + 1,(ulong)(local_34 - 1));
          buffer_00[1] = '.';
          buffer_00 = buffer_00 + local_34;
        }
        uVar4 = uVar8 - 1;
        bVar1 = (int)uVar8 < 1;
        buffer_00[1] = 'e';
        buffer_00[2] = '-';
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        buffer_00[(ulong)bVar1 + 2] = (char)(uVar8 / 100) + '0';
        uVar7 = (ulong)((char)((ulong)uVar8 / 100) != '\0');
        *(undefined2 *)(buffer_00 + uVar7 + 2 + (ulong)bVar1) =
             *(undefined2 *)(digits_lut + (ulong)(uVar8 % 100) * 2);
        buffer_00[uVar7 + 4 + (ulong)bVar1] = '\0';
        uVar9 = ((local_34 - (local_34 < 2)) + (uint)bVar1 + 2) + uVar7 + 2;
      }
      return uVar9 + (v < 0.0);
    }
    if (v <= 0.0) {
      builtin_strncpy(buffer,"-inf",5);
      return 4;
    }
    builtin_strncpy(buffer,"inf",4);
  }
  return 3;
}

Assistant:

inline std::size_t ftoa(FloatType v, CharType* buffer) noexcept
	{
		if (std::isnan(v))
		{
			buffer[0] = 'n';
			buffer[1] = 'a';
			buffer[2] = 'n';
			buffer[3] = '\0';

			return 3;
		}
		else if (std::isinf(v))
		{
			if (v > 0)
			{
				buffer[0] = 'i';
				buffer[1] = 'n';
				buffer[2] = 'f';
				buffer[3] = '\0';

				return 3;
			}
			else
			{
				buffer[0] = '-';
				buffer[1] = 'i';
				buffer[2] = 'n';
				buffer[3] = 'f';
				buffer[4] = '\0';

				return 4;
			}
		}
		else if (v == 0)
		{
			buffer[0] = '0';
			buffer[1] = '\0';

			return 1;
		}
		else
		{
			*buffer = '-';
			buffer += v < 0;

			constexpr int alpha(grisu_parameters<FloatType>.alpha), gamma(grisu_parameters<FloatType>.gamma);
			constexpr unsigned int decimal_scientific_threshold(16);

			int len, K;

			grisu2<alpha, gamma>(v, buffer, &len, &K);
			return (v < 0) + prettify<decimal_scientific_threshold>(buffer, len, K);
		}
	}